

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::DescriptorBuilder::~DescriptorBuilder(DescriptorBuilder *this)

{
  DescriptorBuilder *this_local;
  
  std::__cxx11::string::~string((string *)&this->undefine_resolved_name_);
  std::__cxx11::string::~string((string *)&this->possible_undeclared_dependency_name_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~flat_hash_set(&this->unused_dependency_);
  absl::lts_20250127::
  flat_hash_map<const_google::protobuf::Descriptor_*,_google::protobuf::DescriptorBuilder::MessageHints,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::Descriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::Descriptor_*const,_google::protobuf::DescriptorBuilder::MessageHints>_>_>
  ::~flat_hash_map(&this->message_hints_);
  absl::lts_20250127::
  flat_hash_set<const_google::protobuf::FileDescriptor_*,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FileDescriptor_*,_void>::Eq,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~flat_hash_set(&this->dependencies_);
  std::__cxx11::string::~string((string *)&this->filename_);
  std::
  vector<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
  ::~vector(&this->options_to_interpret_);
  std::optional<google::protobuf::FeatureResolver>::~optional(&this->feature_resolver_);
  return;
}

Assistant:

DescriptorBuilder::~DescriptorBuilder() = default;